

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ricab[P]scope_guard/build_O1/_deps/catch2-src/single_include/catch2/catch.hpp:9836:20)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ricab[P]scope_guard_build_O1__deps_catch2_src_single_include_catch2_catch_hpp:9836:20)>
          *this,string *arg)

{
  int temp;
  int local_4c;
  ParserResult local_48;
  
  local_4c = 0;
  convertInto<int>(&local_48,arg,&local_4c);
  if (local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.m_type
      == Ok) {
    ((this->m_lambda).config)->abortAfter = local_4c;
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_0019f788;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type =
         local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
         m_type;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_0019f788;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_errorMessage,
               local_48.m_errorMessage._M_dataplus._M_p,
               local_48.m_errorMessage._M_dataplus._M_p + local_48.m_errorMessage._M_string_length);
  }
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_0019f788;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_errorMessage._M_dataplus._M_p != &local_48.m_errorMessage.field_2) {
    operator_delete(local_48.m_errorMessage._M_dataplus._M_p,
                    local_48.m_errorMessage.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }